

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall nnad::Matrix<double>::Transpose(Matrix<double> *this)

{
  value_type vVar1;
  allocator_type *__a;
  reference pvVar2;
  int *in_RDI;
  int temp;
  int j;
  int i;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  vector<double,_std::allocator<double>_> new_Matrix;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  int local_38;
  undefined1 local_21;
  vector<double,_std::allocator<double>_> local_20;
  
  __a = (allocator_type *)(long)(in_RDI[1] * *in_RDI);
  __n = &local_21;
  std::allocator<double>::allocator((allocator<double> *)0x1052c1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_type)__n,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x1052e1);
  for (local_38 = 0; local_38 < *in_RDI; local_38 = local_38 + 1) {
    for (iVar3 = 0; iVar3 < in_RDI[1]; iVar3 = iVar3 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),
                          (long)(local_38 * in_RDI[1] + iVar3));
      vVar1 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_20,(long)(iVar3 * *in_RDI + local_38));
      *pvVar2 = vVar1;
    }
  }
  iVar3 = *in_RDI;
  *in_RDI = in_RDI[1];
  in_RDI[1] = iVar3;
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000040,in_stack_00000038);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a);
  return;
}

Assistant:

void Transpose()
    {
      std::vector<T> new_Matrix(_Columns * _Lines);
      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          new_Matrix[j*_Lines + i] = _Matrix[i * _Columns + j];

      const int temp = _Lines;
      _Lines   = _Columns;
      _Columns = temp;
      _Matrix  = new_Matrix;
    }